

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::DictionaryTypeHandlerBase<int>::SetProperty_Internal<false>
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,PropertyId propertyId,
          Var value,PropertyOperationFlags flags,PropertyValueInfo *info,bool isInit)

{
  ScriptContext *this_00;
  ThreadContext *pTVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  int iVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  byte bVar8;
  ulong uVar9;
  int local_5c;
  PropertyRecord *pPStack_58;
  int i;
  PropertyRecord *propertyRecord;
  PropertyValueInfo *local_48;
  ulong local_40;
  DictionaryPropertyDescriptor<int> *local_38;
  DictionaryPropertyDescriptor<int> *descriptor;
  
  uVar9 = (ulong)flags;
  this_00 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  propertyRecord = (PropertyRecord *)value;
  local_48 = info;
  bVar3 = Phases::IsEnabled((Phases *)&DAT_015a4e90,IsConcatSpreadableCachePhase);
  if ((propertyId != 0x13) || (bVar3)) {
    if (propertyId == -1) {
      AssertCount = AssertCount + 1;
      local_40 = uVar9;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x34d,"(propertyId != Constants::NoProperty)",
                                  "propertyId != Constants::NoProperty");
      if (!bVar3) goto LAB_00da4faf;
      *puVar7 = 0;
      uVar9 = local_40;
    }
  }
  else {
    Output::Trace(IsConcatSpreadableCachePhase,L"IsConcatSpreadableCache invalidated\n");
    pTVar1 = this_00->threadContext;
    (pTVar1->isConcatSpreadableCache).type0 = (Type *)0x0;
    (pTVar1->isConcatSpreadableCache).type1 = (Type *)0x0;
  }
  pPStack_58 = ScriptContext::GetPropertyName(this_00,propertyId);
  bVar3 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&stack0xffffffffffffffa8,&local_38,&local_5c);
  if (!bVar3) {
    if (pPStack_58->isNumeric == true) {
      uVar4 = PropertyRecord::GetNumericValue(pPStack_58);
      iVar5 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x2d])
                        (this,instance,(ulong)uVar4,propertyRecord,uVar9 & 0xffffffff);
      return iVar5;
    }
    BVar6 = AddProperty(this,instance,pPStack_58,propertyRecord,'\a',local_48,
                        (PropertyOperationFlags)uVar9,(uVar9 & 5) != 0,SideEffects_Any);
    return BVar6;
  }
  if (((local_38->flags & (UsedAsFixed|IsFixed)) != None) &&
     (((local_38->Attributes & 8) != 0 ||
      (((local_38->Data == -1 && (local_38->Getter == -1)) && (local_38->Setter == -1)))))) {
    AssertCount = AssertCount + 1;
    local_40 = uVar9;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x352,"(descriptor->SanityCheckFixedBits())",
                                "descriptor->SanityCheckFixedBits()");
    if (!bVar3) {
LAB_00da4faf:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
    uVar9 = local_40;
  }
  bVar8 = local_38->Attributes;
  if ((bVar8 & 8) == 0) {
    if (((bVar8 & 4) == 0) && ((bVar8 & 0x10) == 0 || (local_38->flags & IsShadowed) != None)) {
      if ((uVar9 & 8) == 0) {
        JavascriptError::ThrowCantAssignIfStrictMode((PropertyOperationFlags)uVar9,this_00);
      }
      if (local_48 == (PropertyValueInfo *)0x0) {
        return 0;
      }
      local_48->m_instance = &instance->super_RecyclableObject;
      local_48->m_propertyIndex = 0xffff;
      local_48->m_attributes = '\0';
      local_48->flags = InlineCacheNoFlags;
      return 0;
    }
    if ((!isInit) || ((local_38->flags & IsAccessor) == None)) goto LAB_00da4f76;
  }
  else {
    if (((uVar9 & 8) == 0) &&
       (bVar3 = DynamicTypeHandler::VerifyIsExtensible
                          (&this->super_DynamicTypeHandler,this_00,(uVar9 & 5) != 0), !bVar3)) {
      return 0;
    }
    ScriptContext::InvalidateProtoCaches(this_00,propertyId);
    bVar8 = 7;
    if ((local_38->Attributes & 0x10) != 0) {
      bVar8 = local_38->Attributes & 0xd0 | 7;
    }
    local_38->Attributes = bVar8;
    DynamicObject::SetHasNoEnumerableProperties(instance,false);
  }
  DictionaryPropertyDescriptor<int>::ConvertToData(local_38);
LAB_00da4f76:
  SetPropertyWithDescriptor<false>
            (this,instance,pPStack_58,&local_38,propertyRecord,(PropertyOperationFlags)uVar9,
             local_48);
  return 1;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::SetProperty_Internal(DynamicObject* instance, PropertyId propertyId, Var value, PropertyOperationFlags flags, PropertyValueInfo* info, bool isInit)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        DictionaryPropertyDescriptor<T>* descriptor;
        bool throwIfNotExtensible = (flags & (PropertyOperation_ThrowIfNotExtensible | PropertyOperation_StrictMode)) != 0;
        bool isForce = (flags & PropertyOperation_Force) != 0;

        JavascriptLibrary::CheckAndInvalidateIsConcatSpreadableCache(propertyId, scriptContext);

        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = scriptContext->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
#if ENABLE_FIXED_FIELDS
            Assert(descriptor->SanityCheckFixedBits());
#endif
            if (descriptor->Attributes & PropertyDeleted)
            {
                if (!isForce)
                {
                    if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                    {
                        return false;
                    }
                }
                scriptContext->InvalidateProtoCaches(propertyId);
                if (descriptor->Attributes & PropertyLetConstGlobal)
                {
                    descriptor->Attributes = PropertyDynamicTypeDefaults | (descriptor->Attributes & (PropertyLetConstGlobal | PropertyNoRedecl));
                }
                else
                {
                    descriptor->Attributes = PropertyDynamicTypeDefaults;
                }
                instance->SetHasNoEnumerableProperties(false);
                descriptor->ConvertToData();
            }
            else if (!allowLetConstGlobal && descriptor->HasNonLetConstGlobal() && !(descriptor->Attributes & PropertyWritable))
            {
                if (!isForce)
                {
                    JavascriptError::ThrowCantAssignIfStrictMode(flags, scriptContext);
                }

                // Since we separate LdFld and StFld caches there is no point in caching for StFld with non-writable properties, except perhaps
                // to prepopulate the type property cache (which we do share between LdFld and StFld), for potential future field loads.  This
                // would require additional handling in CacheOperators::CachePropertyWrite, such that for !info-IsWritable() we don't populate
                // the local cache (that would be illegal), but still populate the type's property cache.
                PropertyValueInfo::SetNoCache(info, instance);
                return false;
            }
            else if (isInit && descriptor->GetIsAccessor())
            {
                descriptor->ConvertToData();
            }
            SetPropertyWithDescriptor<allowLetConstGlobal>(instance, propertyRecord, &descriptor, value, flags, info);
            return true;
        }

        // Always check numeric propertyRecord. This may create objectArray.
        if (propertyRecord->IsNumeric())
        {
            // Calls this or subclass implementation
            return SetItem(instance, propertyRecord->GetNumericValue(), value, flags);
        }
        return this->AddProperty(instance, propertyRecord, value, PropertyDynamicTypeDefaults, info, flags, throwIfNotExtensible, SideEffects_Any);
        }